

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZSolutionMatrix_*,_10>::Resize
          (TPZManVector<TPZSolutionMatrix_*,_10> *this,int64_t newsize)

{
  long lVar1;
  TPZSolutionMatrix **ppTVar2;
  long lVar3;
  TPZSolutionMatrix **ppTVar4;
  ulong uVar5;
  double dVar6;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar1 = (this->super_TPZVec<TPZSolutionMatrix_*>).fNElements;
  if (lVar1 == newsize) {
    return;
  }
  lVar3 = (this->super_TPZVec<TPZSolutionMatrix_*>).fNAlloc;
  if (newsize <= lVar3) {
    (this->super_TPZVec<TPZSolutionMatrix_*>).fNElements = newsize;
    return;
  }
  if (10 < (ulong)newsize) {
    dVar6 = (double)lVar3 * 1.2;
    uVar5 = (long)dVar6;
    if (dVar6 < (double)newsize) {
      uVar5 = newsize;
    }
    ppTVar4 = (TPZSolutionMatrix **)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
    ppTVar2 = (this->super_TPZVec<TPZSolutionMatrix_*>).fStore;
    if (0 < lVar1) {
      lVar3 = 0;
      do {
        ppTVar4[lVar3] = ppTVar2[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    if (ppTVar2 != (TPZSolutionMatrix **)0x0 && ppTVar2 != this->fExtAlloc) {
      operator_delete__(ppTVar2);
    }
    (this->super_TPZVec<TPZSolutionMatrix_*>).fStore = ppTVar4;
    (this->super_TPZVec<TPZSolutionMatrix_*>).fNElements = newsize;
    (this->super_TPZVec<TPZSolutionMatrix_*>).fNAlloc = uVar5;
    return;
  }
  ppTVar4 = (this->super_TPZVec<TPZSolutionMatrix_*>).fStore;
  ppTVar2 = this->fExtAlloc;
  if (ppTVar4 == ppTVar2) goto LAB_0126d66a;
  if (lVar1 < 1) {
    if (ppTVar4 != (TPZSolutionMatrix **)0x0) goto LAB_0126d661;
  }
  else {
    lVar3 = 0;
    do {
      ppTVar2[lVar3] = ppTVar4[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
LAB_0126d661:
    operator_delete__(ppTVar4);
  }
  (this->super_TPZVec<TPZSolutionMatrix_*>).fStore = ppTVar2;
LAB_0126d66a:
  (this->super_TPZVec<TPZSolutionMatrix_*>).fNElements = newsize;
  (this->super_TPZVec<TPZSolutionMatrix_*>).fNAlloc = 0;
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}